

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Detonation_PDU.cpp
# Opt level: O0

void __thiscall KDIS::PDU::Detonation_PDU::Detonation_PDU(Detonation_PDU *this)

{
  MunitionDescriptor *this_00;
  KRef_Ptr<KDIS::DATA_TYPE::Descriptor> local_38;
  Detonation_PDU *local_10;
  Detonation_PDU *this_local;
  
  local_10 = this;
  Warfare_Header::Warfare_Header(&this->super_Warfare_Header);
  (this->super_Warfare_Header).super_Header.super_Header6._vptr_Header6 =
       (_func_int **)&PTR__Detonation_PDU_0032e470;
  DATA_TYPE::Vector::Vector(&this->m_Velocity);
  DATA_TYPE::WorldCoordinates::WorldCoordinates(&this->m_LocationWorldCoords);
  UTILS::KRef_Ptr<KDIS::DATA_TYPE::Descriptor>::KRef_Ptr(&this->m_pDescriptor);
  DATA_TYPE::Vector::Vector(&this->m_LocationEntityCoords);
  this->m_ui8NumOfVariableParams = '\0';
  std::
  vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>_>_>
  ::vector(&this->m_vVariableParameters);
  (this->super_Warfare_Header).super_Header.super_Header6.m_ui8PDUType = '\x03';
  (this->super_Warfare_Header).super_Header.super_Header6.m_ui16PDULength = 0x68;
  this_00 = (MunitionDescriptor *)operator_new(0x20);
  DATA_TYPE::MunitionDescriptor::MunitionDescriptor(this_00);
  UTILS::KRef_Ptr<KDIS::DATA_TYPE::Descriptor>::KRef_Ptr(&local_38,(Descriptor *)this_00);
  SetDescriptor(this,&local_38);
  UTILS::KRef_Ptr<KDIS::DATA_TYPE::Descriptor>::~KRef_Ptr(&local_38);
  return;
}

Assistant:

Detonation_PDU::Detonation_PDU() :
    m_ui8NumOfVariableParams( 0 )
{
    m_ui8PDUType = Detonation_PDU_Type;
    m_ui16PDULength = DETONATION_PDU_SIZE;
    SetDescriptor( DescPtr( new MunitionDescriptor() ) );
}